

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

bool __thiscall OpenMD::SelectionCompiler::clauseNot(SelectionCompiler *this)

{
  pointer pTVar1;
  bool bVar2;
  Token tokenNot;
  Token TStack_28;
  
  pTVar1 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->itokenInfix !=
       ((long)(this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) * -0x5555555555555555)
     && (pTVar1[this->itokenInfix].tok == 0x405)) {
    tokenNext(&TStack_28,this);
    bVar2 = clauseNot(this);
    if (bVar2) {
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (&this->ltokenPostfix,&TStack_28);
    }
    if (TStack_28.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*TStack_28.value._M_manager)(_Op_destroy,&TStack_28.value,(_Arg *)0x0);
    }
    return bVar2;
  }
  bVar2 = clausePrimitive(this);
  return bVar2;
}

Assistant:

bool SelectionCompiler::clauseNot() {
    if (tokPeek() == Token::opNot) {
      Token tokenNot = tokenNext();
      if (!clauseNot()) { return false; }
      return addTokenToPostfix(tokenNot);
    }
    return clausePrimitive();
  }